

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  ulong uVar1;
  TestInfo *pTVar2;
  InternalRunDeathTestFlag *pIVar3;
  _union_1457 _Var4;
  size_type *psVar5;
  int iVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  int *piVar9;
  void *__addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  _union_1457 extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  _union_1457 extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar12;
  undefined8 uVar13;
  const_iterator __position;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_t __len;
  int pipe_fd [2];
  Arguments args;
  int death_test_index;
  ExecDeathTestArgs args_2;
  string internal_flag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  sigaction ignore_sigprof_action;
  string filter_flag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  int local_1f0;
  int local_1ec;
  string local_1e8;
  int local_1c8 [2];
  string local_1c0;
  size_type *local_1a0;
  size_type local_198;
  size_type local_190;
  undefined8 uStack_188;
  _union_1457 local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170 [8];
  _union_1457 local_e8;
  undefined1 local_e0 [8];
  size_type local_d8;
  ulong uStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  UnitTest::GetInstance();
  pTVar2 = (UnitTest::GetInstance::instance.impl_)->current_test_info_;
  pIVar3 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_1c8[0] = (pTVar2->result_).death_test_count_;
  if (pIVar3 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar3->write_fd_;
    return EXECUTE_TEST;
  }
  iVar6 = pipe(&local_1f0);
  if (iVar6 == -1) {
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"CHECK failed: File ","");
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2d0,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                       );
    local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar14 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p == paVar14) {
      local_2f0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    }
    else {
      local_2f0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_2f0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2f0,", line ");
    local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar14 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar14) {
      local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_2b0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    local_250._M_dataplus._M_p._0_4_ = 0x58c;
    StreamableToString<int>(&local_270,(int *)&local_250);
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      uVar13 = local_2b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_270._M_string_length + local_2b0._M_string_length) {
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        uVar13 = local_270.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_270._M_string_length + local_2b0._M_string_length)
      goto LAB_00141d65;
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_270,0,0,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
    }
    else {
LAB_00141d65:
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_2b0,local_270._M_dataplus._M_p,local_270._M_string_length);
    }
    local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar14 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p == paVar14) {
      local_290.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    }
    else {
      local_290.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_290._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar8->_M_string_length = 0;
    paVar14->_M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_290,": ");
    local_e8.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
    paVar14 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.sa_handler == paVar14) {
      local_d8 = paVar14->_M_allocated_capacity;
      uStack_d0 = *(ulong *)((long)&pbVar8->field_2 + 8);
      local_e8.sa_handler = (__sighandler_t)(local_e0 + 8);
    }
    else {
      local_d8 = paVar14->_M_allocated_capacity;
    }
    local_e0 = (undefined1  [8])pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_e8,"pipe(pipe_fd) != -1");
    local_180.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
    paVar10 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.sa_handler == paVar10) {
      local_170[0]._0_8_ = paVar10->_M_allocated_capacity;
      local_170[0]._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_180.sa_handler = (__sighandler_t)local_170;
    }
    else {
      local_170[0]._0_8_ = paVar10->_M_allocated_capacity;
    }
    local_178 = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    DeathTestAbort((string *)&local_180);
    pbVar8 = extraout_RAX_02;
    local_180 = extraout_RDX_02;
LAB_00142795:
    local_170[0]._0_8_ = paVar10->_M_allocated_capacity;
  }
  else {
    iVar6 = fcntl(local_1ec,2,0);
    if (iVar6 != -1) {
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"--","");
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2f0,"gtest_");
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if (paVar14 == paVar10) {
        local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2b0._M_dataplus._M_p = (pointer)paVar14;
      }
      local_2b0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2b0,"filter=");
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if (paVar14 == paVar10) {
        local_290.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_290.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_290._M_dataplus._M_p = (pointer)paVar14;
      }
      local_290._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_290,(pTVar2->test_suite_name_)._M_dataplus._M_p);
      local_e8.sa_handler = (__sighandler_t)(local_e0 + 8);
      _Var4.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
      paVar14 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var4.sa_handler == paVar14) {
        local_d8 = paVar14->_M_allocated_capacity;
        uStack_d0 = *(ulong *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_d8 = paVar14->_M_allocated_capacity;
        local_e8.sa_handler = _Var4.sa_handler;
      }
      local_e0 = (undefined1  [8])pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8
                      ,".");
      local_180.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
      paVar14 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.sa_handler == paVar14) {
        local_170[0]._0_8_ = paVar14->_M_allocated_capacity;
        local_170[0]._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_180.sa_handler = (__sighandler_t)local_170;
      }
      else {
        local_170[0]._0_8_ = paVar14->_M_allocated_capacity;
      }
      local_178 = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_180,(pTVar2->name_)._M_dataplus._M_p);
      paVar14 = &local_40;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if (local_50 == paVar10) {
        local_40._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_40._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_50 = paVar14;
      }
      else {
        local_40._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_48 = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.sa_handler != local_170) {
        operator_delete(local_180.sa_handler,local_170[0]._M_allocated_capacity + 1);
      }
      if (local_e8.sa_handler != (__sighandler_t)(local_e0 + 8)) {
        operator_delete(local_e8.sa_handler,local_d8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--","");
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_230,"gtest_");
      local_250._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p == paVar10) {
        local_250.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_250.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      }
      else {
        local_250.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_250._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_250,"internal_run_death_test=");
      local_270._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p == paVar10) {
        local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      }
      else {
        local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_270._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_270,this->file_);
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar8->_M_dataplus)._M_p;
      paVar11 = &pbVar8->field_2;
      if (paVar10 == paVar11) {
        local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2d0._M_dataplus._M_p = (pointer)paVar10;
      }
      local_2d0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2d0,"|");
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar8->_M_dataplus)._M_p;
      paVar11 = &pbVar8->field_2;
      if (paVar10 == paVar11) {
        local_2f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_2f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2f0._M_dataplus._M_p = (pointer)paVar10;
      }
      local_2f0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      StreamableToString<int>(&local_210,&this->line_);
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        uVar13 = local_2f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_210._M_string_length + local_2f0._M_string_length) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_210._M_dataplus._M_p._4_4_,local_210._M_dataplus._M_p._0_4_) !=
            &local_210.field_2) {
          uVar13 = local_210.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_210._M_string_length + local_2f0._M_string_length)
        goto LAB_001408c5;
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_210,0,0,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
      }
      else {
LAB_001408c5:
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_2f0,
                           (char *)CONCAT44(local_210._M_dataplus._M_p._4_4_,
                                            local_210._M_dataplus._M_p._0_4_),
                           local_210._M_string_length);
      }
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if (paVar11 == paVar10) {
        local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2b0._M_dataplus._M_p = (pointer)paVar11;
      }
      local_2b0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      paVar10->_M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2b0,"|");
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar8->_M_dataplus)._M_p;
      paVar11 = &pbVar8->field_2;
      if (paVar10 == paVar11) {
        local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_290._M_dataplus._M_p = (pointer)paVar10;
      }
      local_290._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      StreamableToString<int>(&local_1e8,local_1c8);
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar13 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_1e8._M_string_length + local_290._M_string_length) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          uVar13 = local_1e8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_1e8._M_string_length + local_290._M_string_length)
        goto LAB_001409ec;
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_1e8,0,0,local_290._M_dataplus._M_p,local_290._M_string_length);
      }
      else {
LAB_001409ec:
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_290,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
      }
      local_e8.sa_handler = (__sighandler_t)(local_e0 + 8);
      _Var4.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var4.sa_handler == paVar10) {
        local_d8 = paVar10->_M_allocated_capacity;
        uStack_d0 = *(ulong *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_d8 = paVar10->_M_allocated_capacity;
        local_e8.sa_handler = _Var4.sa_handler;
      }
      local_e0 = (undefined1  [8])pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      paVar10->_M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8
                      ,"|");
      local_180.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.sa_handler == paVar10) {
        local_170[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_170[0]._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_180.sa_handler = (__sighandler_t)local_170;
      }
      else {
        local_170[0]._0_8_ = paVar10->_M_allocated_capacity;
      }
      local_178 = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      StreamableToString<int>(&local_1c0,&local_1ec);
      uVar1 = local_178 + CONCAT44(local_1c0._M_string_length._4_4_,(int)local_1c0._M_string_length)
      ;
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.sa_handler != local_170) {
        uVar13 = local_170[0]._M_allocated_capacity;
      }
      if ((ulong)uVar13 < uVar1) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          uVar13 = local_1c0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < uVar1) goto LAB_00140b32;
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_1c0,0,0,(char *)local_180.sa_handler,local_178);
      }
      else {
LAB_00140b32:
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_180,local_1c0._M_dataplus._M_p,
                           CONCAT44(local_1c0._M_string_length._4_4_,(int)local_1c0._M_string_length
                                   ));
      }
      local_1a0 = &local_190;
      psVar5 = (size_type *)(pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5 == paVar10) {
        local_190 = paVar10->_M_allocated_capacity;
        uStack_188 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      }
      else {
        local_190 = paVar10->_M_allocated_capacity;
        local_1a0 = psVar5;
      }
      local_198 = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      paVar10->_M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.sa_handler != local_170) {
        operator_delete(local_180.sa_handler,local_170[0]._M_allocated_capacity + 1);
      }
      if (local_e8.sa_handler != (__sighandler_t)(local_e0 + 8)) {
        operator_delete(local_e8.sa_handler,local_d8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_210._M_dataplus._M_p._4_4_,local_210._M_dataplus._M_p._0_4_) !=
          &local_210.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_210._M_dataplus._M_p._4_4_,local_210._M_dataplus._M_p._0_4_),
                        local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      Arguments::Arguments((Arguments *)&local_1e8);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&g_argvs_abi_cxx11_;
      if (g_injected_test_argvs_abi_cxx11_ !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        __x = g_injected_test_argvs_abi_cxx11_;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_180,__x);
      Arguments::AddArguments<std::__cxx11::string>
                ((Arguments *)&local_1e8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_180);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_180);
      __position._M_current = (char **)(local_1e8._M_string_length - 8);
      local_180.sa_handler = (__sighandler_t)strdup(local_50->_M_local_buf);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)&local_1e8,__position,
                 (value_type *)&local_180.sa_handler);
      local_180.sa_handler = (__sighandler_t)strdup((char *)local_1a0);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)&local_1e8,
                 (char **)(local_1e8._M_string_length - 8),(value_type *)&local_180.sa_handler);
      local_180.sa_handler = (__sighandler_t)local_170;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &DeathTest::last_death_test_message__abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.sa_handler != local_170) {
        operator_delete(local_180.sa_handler,local_170[0]._M_allocated_capacity + 1);
      }
      CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
      fflush((FILE *)0x0);
      local_1c0._M_dataplus._M_p = local_1e8._M_dataplus._M_p;
      local_1c0._M_string_length._0_4_ = local_1f0;
      memset(&local_e8,0,0x98);
      sigemptyset((sigset_t *)local_e0);
      local_e8 = (_union_1457)0x1;
      do {
        iVar6 = sigaction(0x1b,(sigaction *)&local_e8,(sigaction *)&local_180);
        if (iVar6 != -1) {
          if (FLAGS_gtest_death_test_use_fork != '\0') {
            iVar6 = fork();
            if (iVar6 == 0) {
              ExecDeathTestChildMain(&local_1c0);
              goto LAB_0014161d;
            }
LAB_00140fe6:
            goto LAB_00140fee;
          }
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
LAB_0014161d:
            AssumeRole();
          }
          iVar6 = getpagesize();
          __len = (size_t)(iVar6 * 2);
          __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
          if (__addr == (void *)0xffffffffffffffff) {
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_250,"CHECK failed: File ","");
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_250,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                             );
            local_270._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
            paVar10 = &pbVar8->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p == paVar10) {
              local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            }
            else {
              local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            }
            local_270._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_270,", line ");
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar8->_M_dataplus)._M_p;
            paVar11 = &pbVar8->field_2;
            if (paVar10 != paVar11) goto LAB_00142095;
            local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            goto LAB_001420a2;
          }
          lVar12 = 0;
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
            lVar12 = __len - 0x40;
          }
          if (((uint)(iVar6 * 2) < 0x41) || (((ulong)(lVar12 + (long)__addr) & 0x3f) != 0)) {
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_250,"CHECK failed: File ","");
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_250,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                             );
            local_270._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
            paVar10 = &pbVar8->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p == paVar10) {
              local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            }
            else {
              local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            }
            local_270._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_270,", line ");
            local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
            paVar10 = &pbVar8->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p == paVar10) {
              local_2d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            }
            else {
              local_2d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            }
            local_2d0._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
            local_210._M_dataplus._M_p._0_4_ = 0x563;
            StreamableToString<int>(&local_230,(int *)&local_210);
            uVar13 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              uVar13 = local_2d0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar13 < local_230._M_string_length + local_2d0._M_string_length) {
              uVar13 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                uVar13 = local_230.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar13 < local_230._M_string_length + local_2d0._M_string_length)
              goto LAB_001421d8;
              pbVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                 (&local_230,0,0,local_2d0._M_dataplus._M_p,
                                  local_2d0._M_string_length);
            }
            else {
LAB_001421d8:
              pbVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_2d0,local_230._M_dataplus._M_p,local_230._M_string_length);
            }
            local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
            paVar10 = &pbVar8->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p == paVar10) {
              local_2f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
            }
            else {
              local_2f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            }
            local_2f0._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
            pbVar8->_M_string_length = 0;
            paVar10->_M_local_buf[0] = '\0';
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_2f0,": ");
            local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
            paVar10 = &pbVar8->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p == paVar10) {
              local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
            }
            else {
              local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            }
            local_2b0._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_2b0,
                              "static_cast<size_t>(stack_size) > kMaxStackAlignment && reinterpret_cast<uintptr_t>(stack_top) % kMaxStackAlignment == 0"
                             );
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar8->_M_dataplus)._M_p;
            paVar11 = &pbVar8->field_2;
            if (paVar10 != paVar11) goto LAB_0014294e;
            local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            goto LAB_0014295b;
          }
          iVar6 = clone(ExecDeathTestChildMain,(void *)(lVar12 + (long)__addr),0x11,&local_1c0);
          iVar7 = munmap(__addr,__len);
          if (iVar7 != -1) goto LAB_00140fe6;
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_250,"CHECK failed: File ","");
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_250,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                         );
          local_270._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
          paVar10 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p == paVar10) {
            local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          }
          else {
            local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          }
          local_270._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_270,", line ");
          local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
          paVar10 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p == paVar10) {
            local_2d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          }
          else {
            local_2d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          }
          local_2d0._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          local_210._M_dataplus._M_p._0_4_ = 0x567;
          StreamableToString<int>(&local_230,(int *)&local_210);
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            uVar13 = local_2d0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_230._M_string_length + local_2d0._M_string_length) {
            uVar13 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              uVar13 = local_230.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar13 < local_230._M_string_length + local_2d0._M_string_length)
            goto LAB_00142281;
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::replace(&local_230,0,0,local_2d0._M_dataplus._M_p,local_2d0._M_string_length)
            ;
          }
          else {
LAB_00142281:
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::_M_append(&local_2d0,local_230._M_dataplus._M_p,local_230._M_string_length);
          }
          local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
          paVar10 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p == paVar10) {
            local_2f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          }
          else {
            local_2f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          }
          local_2f0._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
          pbVar8->_M_string_length = 0;
          paVar10->_M_local_buf[0] = '\0';
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_2f0,": ");
          local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
          paVar10 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p == paVar10) {
            local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          }
          else {
            local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          }
          local_2b0._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_2b0,"munmap(stack, stack_size) != -1");
          local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar8->_M_dataplus)._M_p;
          paVar11 = &pbVar8->field_2;
          if (paVar10 != paVar11) goto LAB_0014297c;
          local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
          goto LAB_00142989;
        }
        piVar9 = __errno_location();
      } while (*piVar9 == 4);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"CHECK failed: File ","")
      ;
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_230,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                     );
      local_250._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p == paVar10) {
        local_250.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_250.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      }
      else {
        local_250.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_250._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_250,", line ");
      local_270._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p == paVar10) {
        local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      }
      else {
        local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_270._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      local_1c8[1] = 0x549;
      StreamableToString<int>(&local_210,local_1c8 + 1);
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        uVar13 = local_270.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_210._M_string_length + local_270._M_string_length) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_210._M_dataplus._M_p._4_4_,local_210._M_dataplus._M_p._0_4_) !=
            &local_210.field_2) {
          uVar13 = local_210.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_210._M_string_length + local_270._M_string_length)
        goto LAB_00141370;
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_210,0,0,local_270._M_dataplus._M_p,local_270._M_string_length);
      }
      else {
LAB_00141370:
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_270,
                           (char *)CONCAT44(local_210._M_dataplus._M_p._4_4_,
                                            local_210._M_dataplus._M_p._0_4_),
                           local_210._M_string_length);
      }
      local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p == paVar10) {
        local_2d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      }
      else {
        local_2d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_2d0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      paVar10->_M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2d0,": ");
      local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p == paVar10) {
        local_2f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      }
      else {
        local_2f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_2f0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2f0,
                      "sigaction( SIGPROF, &ignore_sigprof_action, &saved_sigprof_action)");
      local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar10) {
        local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_2b0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2b0," != -1");
      local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar11 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p == paVar11) {
        local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_290._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      DeathTestAbort(&local_290);
      pbVar8 = extraout_RAX;
      paVar10 = extraout_RDX;
      goto LAB_00142030;
    }
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"CHECK failed: File ","");
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2d0,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                       );
    local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar14 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p == paVar14) {
      local_2f0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    }
    else {
      local_2f0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_2f0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2f0,", line ");
    local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar14 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar14) {
      local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_2b0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    local_250._M_dataplus._M_p._0_4_ = 0x58f;
    StreamableToString<int>(&local_270,(int *)&local_250);
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      uVar13 = local_2b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_270._M_string_length + local_2b0._M_string_length) {
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        uVar13 = local_270.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_270._M_string_length + local_2b0._M_string_length)
      goto LAB_00141e09;
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_270,0,0,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
    }
    else {
LAB_00141e09:
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_2b0,local_270._M_dataplus._M_p,local_270._M_string_length);
    }
    local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar14 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p == paVar14) {
      local_290.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    }
    else {
      local_290.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_290._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar8->_M_string_length = 0;
    paVar14->_M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_290,": ");
    local_e8.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
    paVar14 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.sa_handler == paVar14) {
      local_d8 = paVar14->_M_allocated_capacity;
      uStack_d0 = *(ulong *)((long)&pbVar8->field_2 + 8);
      local_e8.sa_handler = (__sighandler_t)(local_e0 + 8);
    }
    else {
      local_d8 = paVar14->_M_allocated_capacity;
    }
    local_e0 = (undefined1  [8])pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_e8,"fcntl(pipe_fd[1], F_SETFD, 0) != -1");
    local_180.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
    paVar10 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.sa_handler != paVar10) goto LAB_00142795;
    local_170[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_170[0]._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_180.sa_handler = (__sighandler_t)local_170;
  }
  paVar14 = &local_2b0.field_2;
  local_178 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort((string *)&local_180);
  pbVar8 = extraout_RAX_03;
  local_2b0._M_dataplus._M_p = (pointer)extraout_RDX_03;
  goto LAB_001427cc;
LAB_00141085:
  do {
    iVar7 = close(local_1ec);
    if (iVar7 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar6;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_1f0;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)&local_1e8);
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0,local_190 + 1);
      }
      if (local_50 != paVar14) {
        operator_delete(local_50,local_40._M_allocated_capacity + 1);
      }
      return OVERSEE_TEST;
    }
    piVar9 = __errno_location();
  } while (*piVar9 == 4);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","");
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_270,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                     );
  local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p == paVar10) {
    local_2d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  }
  else {
    local_2d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2d0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2d0,", line ");
  local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p == paVar10) {
    local_2f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  }
  else {
    local_2f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2f0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_230._M_dataplus._M_p._0_4_ = 0x5a6;
  StreamableToString<int>(&local_250,(int *)&local_230);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    uVar13 = local_2f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_250._M_string_length + local_2f0._M_string_length) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar13 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_250._M_string_length + local_2f0._M_string_length) goto LAB_001414dd;
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_250,0,0,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
  }
  else {
LAB_001414dd:
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_2f0,local_250._M_dataplus._M_p,local_250._M_string_length);
  }
  local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar10) {
    local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2b0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  paVar10->_M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2b0,": ");
  local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p == paVar10) {
    local_290.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_290._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_290,"close(pipe_fd[1])");
  local_e8.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.sa_handler == paVar10) {
    local_d8 = paVar10->_M_allocated_capacity;
    uStack_d0 = *(ulong *)((long)&pbVar8->field_2 + 8);
    local_e8.sa_handler = (__sighandler_t)(local_e0 + 8);
  }
  else {
    local_d8 = paVar10->_M_allocated_capacity;
  }
  local_e0 = (undefined1  [8])pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8
                      ," != -1");
  local_180.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.sa_handler != paVar11) goto LAB_0014205e;
  local_170[0]._0_8_ = paVar11->_M_allocated_capacity;
  local_170[0]._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  local_180.sa_handler = (__sighandler_t)local_170;
  goto LAB_00142071;
  while (piVar9 = __errno_location(), *piVar9 == 4) {
LAB_00140fee:
    iVar7 = sigaction(0x1b,(sigaction *)&local_180,(sigaction *)0x0);
    if (iVar7 != -1) {
      if (iVar6 != -1) goto LAB_00141085;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","")
      ;
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_250,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                     );
      local_270._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p == paVar10) {
        local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      }
      else {
        local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_270._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_270,", line ");
      local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p == paVar10) {
        local_2d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      }
      else {
        local_2d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_2d0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      local_210._M_dataplus._M_p._0_4_ = 0x577;
      StreamableToString<int>(&local_230,(int *)&local_210);
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        uVar13 = local_2d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_230._M_string_length + local_2d0._M_string_length) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          uVar13 = local_230.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_230._M_string_length + local_2d0._M_string_length)
        goto LAB_00141ff3;
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_230,0,0,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
      }
      else {
LAB_00141ff3:
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_2d0,local_230._M_dataplus._M_p,local_230._M_string_length);
      }
      local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p == paVar10) {
        local_2f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      }
      else {
        local_2f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_2f0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      paVar10->_M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2f0,": ");
      local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar10) {
        local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_2b0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2b0,"child_pid != -1");
      local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar11 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p == paVar11) {
        local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_290._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      DeathTestAbort(&local_290);
      pbVar8 = extraout_RAX_04;
      local_290._M_dataplus._M_p = (pointer)extraout_RDX_04;
      goto LAB_00142920;
    }
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"CHECK failed: File ","");
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_230,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googletest/src/gtest-death-test.cc"
                     );
  local_250._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p == paVar10) {
    local_250.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_250.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  }
  else {
    local_250.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_250._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_250,", line ");
  local_270._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p == paVar10) {
    local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  }
  else {
    local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_270._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_1c8[1] = 0x574;
  StreamableToString<int>(&local_210,local_1c8 + 1);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    uVar13 = local_270.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_210._M_string_length + local_270._M_string_length) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_210._M_dataplus._M_p._4_4_,local_210._M_dataplus._M_p._0_4_) !=
        &local_210.field_2) {
      uVar13 = local_210.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_210._M_string_length + local_270._M_string_length) goto LAB_00141431;
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_210,0,0,local_270._M_dataplus._M_p,local_270._M_string_length);
  }
  else {
LAB_00141431:
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_270,
                       (char *)CONCAT44(local_210._M_dataplus._M_p._4_4_,
                                        local_210._M_dataplus._M_p._0_4_),local_210._M_string_length
                      );
  }
  local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p == paVar10) {
    local_2d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  }
  else {
    local_2d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2d0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  paVar10->_M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2d0,": ");
  local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p == paVar10) {
    local_2f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  }
  else {
    local_2f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2f0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2f0,"sigaction(SIGPROF, &saved_sigprof_action, nullptr)");
  local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar10) {
    local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2b0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2b0," != -1");
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if (paVar10 == paVar11) {
    local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
LAB_00142030:
    local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_290._M_dataplus._M_p = (pointer)paVar10;
  }
  local_290._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_290);
  pbVar8 = extraout_RAX_00;
  local_180 = extraout_RDX_00;
LAB_0014205e:
  local_170[0]._0_8_ = paVar11->_M_allocated_capacity;
LAB_00142071:
  local_178 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort((string *)&local_180);
  pbVar8 = extraout_RAX_01;
  paVar10 = extraout_RDX_01;
LAB_00142095:
  local_2d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  local_2d0._M_dataplus._M_p = (pointer)paVar10;
LAB_001420a2:
  local_2d0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_210._M_dataplus._M_p._0_4_ = 0x555;
  StreamableToString<int>(&local_230,(int *)&local_210);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    uVar13 = local_2d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_230._M_string_length + local_2d0._M_string_length) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar13 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_230._M_string_length + local_2d0._M_string_length) goto LAB_0014212f;
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_230,0,0,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
  }
  else {
LAB_0014212f:
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_2d0,local_230._M_dataplus._M_p,local_230._M_string_length);
  }
  local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p == paVar10) {
    local_2f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  }
  else {
    local_2f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2f0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  paVar10->_M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2f0,": ");
  local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar10) {
    local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
LAB_001427cc:
    local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2b0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2b0,"stack != MAP_FAILED");
  local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p == paVar11) {
    local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
LAB_00142920:
    local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_290._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_290);
  pbVar8 = extraout_RAX_05;
  paVar10 = extraout_RDX_05;
LAB_0014294e:
  local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  local_290._M_dataplus._M_p = (pointer)paVar10;
LAB_0014295b:
  local_290._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_290);
  pbVar8 = extraout_RAX_06;
  paVar10 = extraout_RDX_06;
LAB_0014297c:
  local_290.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  local_290._M_dataplus._M_p = (pointer)paVar10;
LAB_00142989:
  local_290._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  Arguments::~Arguments((Arguments *)&local_1e8);
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  if (local_50 != paVar14) {
    operator_delete(local_50,local_40._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_07);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  "filter=" + info->test_suite_name() + "." +
                                  info->name();
  const std::string internal_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                    "internal_run_death_test=" + file_ + "|" +
                                    StreamableToString(line_) + "|" +
                                    StreamableToString(death_test_index) + "|" +
                                    StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}